

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::ParseableFunctionInfo::CleanupToReparseHelper(ParseableFunctionInfo *this)

{
  bool bVar1;
  Utf8SourceInfo *this_00;
  Type local_19;
  ParseableFunctionInfo *this_local;
  
  if (((*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 10 & 1) != 0) &&
     (this->m_dynamicInterpreterThunk != (Type)0x0)) {
    ScriptContext::ReleaseDynamicAsmJsInterpreterThunk
              ((this->super_FunctionProxy).m_scriptContext,(BYTE *)this->m_dynamicInterpreterThunk,
               true);
    this->m_dynamicInterpreterThunk = (Type)0x0;
  }
  SetScopeInfo(this,(ScopeInfo *)0x0);
  SetPropertyIdsForScopeSlotArray(this,(PropertyId *)0x0,0,0);
  this_00 = FunctionProxy::GetUtf8SourceInfo(&this->super_FunctionProxy);
  Utf8SourceInfo::DeleteLineOffsetCache(this_00);
  bVar1 = FunctionProxy::IsClassConstructor(&this->super_FunctionProxy);
  local_19 = Flags_None;
  if (!bVar1) {
    local_19 = Flags_HasNoExplicitReturnValue;
  }
  this->flags = local_19;
  ResetInParams(this);
  *(ushort *)&(this->super_FunctionProxy).field_0x45 =
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0xfdff;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 =
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0xfbff;
  return;
}

Assistant:

void ParseableFunctionInfo::CleanupToReparseHelper()
    {
#if DYNAMIC_INTERPRETER_THUNK
        if (m_isAsmJsFunction && m_dynamicInterpreterThunk)
        {
            m_scriptContext->ReleaseDynamicAsmJsInterpreterThunk((BYTE*)this->m_dynamicInterpreterThunk, true);
            this->m_dynamicInterpreterThunk = nullptr;
        }
#endif

        this->SetScopeInfo(nullptr);
        this->SetPropertyIdsForScopeSlotArray(nullptr, 0);

        this->GetUtf8SourceInfo()->DeleteLineOffsetCache();

        // Reset to default.
        this->flags = this->IsClassConstructor() ? Flags_None : Flags_HasNoExplicitReturnValue;

        ResetInParams();

        this->m_isAsmjsMode = false;
        this->m_isAsmJsFunction = false;
    }